

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall
QTextBrowserPrivate::restoreHistoryEntry(QTextBrowserPrivate *this,HistoryEntry *entry)

{
  undefined1 *puVar1;
  QTextDocument *pQVar2;
  QWidgetTextControl *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QTextCursor *unaff_retaddr;
  QTextCursor cursor;
  ResourceType in_stack_000000bc;
  QUrl *in_stack_000000c0;
  QTextBrowserPrivate *in_stack_000000c8;
  undefined1 b;
  QTextCursor local_10 [4];
  int value;
  QAbstractSlider *this_00;
  
  b = (undefined1)((ulong)in_RDI >> 0x38);
  this_00 = *(QAbstractSlider **)(in_FS_OFFSET + 0x28);
  setSource(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc);
  puVar1 = _local_10;
  value = (int)((ulong)_local_10 >> 0x20);
  QAbstractSlider::setValue(this_00,value);
  _local_10 = puVar1;
  puVar1 = _local_10;
  value = (int)((ulong)_local_10 >> 0x20);
  QAbstractSlider::setValue(this_00,value);
  _local_10 = puVar1;
  if ((*(int *)&in_RSI[1].field_0x14 != -1) && (*(int *)&in_RSI[1].field_0x10 != -1)) {
    _local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QWidgetTextControl::document(in_RSI);
    QTextCursor::QTextCursor(local_10,pQVar2);
    QTextCursor::setPosition((int)local_10,*(MoveMode *)&in_RSI[1].field_0x14);
    QTextCursor::setPosition((int)local_10,*(MoveMode *)&in_RSI[1].field_0x10);
    QWidgetTextControl::setTextCursor
              ((QWidgetTextControl *)entry,unaff_retaddr,SUB81((ulong)this_00 >> 0x38,0));
    QWidgetTextControl::setCursorIsFocusIndicator(in_RSI,(bool)b);
    QTextCursor::~QTextCursor(local_10);
  }
  if (*(QAbstractSlider **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::restoreHistoryEntry(const HistoryEntry &entry)
{
    setSource(entry.url, entry.type);
    hbar->setValue(entry.hpos);
    vbar->setValue(entry.vpos);
    if (entry.focusIndicatorAnchor != -1 && entry.focusIndicatorPosition != -1) {
        QTextCursor cursor(control->document());
        cursor.setPosition(entry.focusIndicatorAnchor);
        cursor.setPosition(entry.focusIndicatorPosition, QTextCursor::KeepAnchor);
        control->setTextCursor(cursor);
        control->setCursorIsFocusIndicator(true);
    }
#ifdef QT_KEYPAD_NAVIGATION
    lastKeypadScrollValue = vbar->value();
    prevFocus = control->textCursor();

    Q_Q(QTextBrowser);
    const QString href = prevFocus.charFormat().anchorHref();
    QUrl url = resolveUrl(href);
    emitHighlighted(url);
#endif
}